

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIScrollBar::setPos(CGUIScrollBar *this,s32 pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  float fVar8;
  
  iVar1 = this->Min;
  iVar2 = this->Max;
  if (pos <= iVar1) {
    pos = iVar1;
  }
  if (iVar2 <= pos) {
    pos = iVar2;
  }
  this->Pos = pos;
  if (1e-06 < ABS((float)(iVar2 - iVar1))) {
    if (this->Horizontal == true) {
      iVar6 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      piVar7 = (int *)&this->field_0x3c;
      piVar5 = (int *)&this->field_0x34;
    }
    else {
      piVar5 = (int *)&this->field_0x30;
      iVar6 = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
      piVar7 = (int *)&this->field_0x38;
    }
    iVar3 = *piVar7;
    iVar4 = *piVar5;
    fVar8 = (float)(iVar3 - iVar4);
    this->DrawPos =
         (int)(fVar8 * 0.5 +
              (float)(pos - iVar1) * ((fVar8 * -3.0 + (float)iVar6) / (float)(iVar2 - iVar1)));
    this->DrawHeight = iVar3 - iVar4;
  }
  return;
}

Assistant:

void CGUIScrollBar::setPos(s32 pos)
{
	Pos = core::s32_clamp(pos, Min, Max);

	if (core::isnotzero(range())) {
		if (Horizontal) {
			f32 f = (RelativeRect.getWidth() - ((f32)RelativeRect.getHeight() * 3.0f)) / range();
			DrawPos = (s32)(((Pos - Min) * f) + ((f32)RelativeRect.getHeight() * 0.5f));
			DrawHeight = RelativeRect.getHeight();
		} else {
			f32 f = (RelativeRect.getHeight() - ((f32)RelativeRect.getWidth() * 3.0f)) / range();

			DrawPos = (s32)(((Pos - Min) * f) + ((f32)RelativeRect.getWidth() * 0.5f));
			DrawHeight = RelativeRect.getWidth();
		}
	}
}